

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_response::add_header<char_const*,char_const*>
          (coro_http_response *this,char *k,char *v)

{
  vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_> *this_00;
  resp_header *in_RDX;
  long in_RDI;
  resp_header *__args;
  undefined2 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 uVar1;
  undefined5 in_stack_ffffffffffffff93;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  this_00 = (vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_> *)(in_RDI + 0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator<char> *)
             CONCAT53(in_stack_ffffffffffffff93,
                      CONCAT12(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90)));
  uVar1 = 1;
  __args = (resp_header *)&stack0xffffffffffffff93;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator<char> *)
             CONCAT53(in_stack_ffffffffffffff93,CONCAT12(uVar1,in_stack_ffffffffffffff90)));
  std::vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>::
  emplace_back<cinatra::resp_header>(this_00,__args);
  resp_header::~resp_header(in_RDX);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff93);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  return;
}

Assistant:

void add_header(auto k, auto v) {
    resp_headers_.emplace_back(resp_header{std::move(k), std::move(v)});
  }